

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

uint randomMT(void)

{
  time_t tVar1;
  uint uVar2;
  int local_14;
  int local_c;
  uint y;
  int cur;
  
  local_c = next;
  next = next + 1;
  if (0x26f < next) {
    if (next < 0x271) {
      next = 0;
    }
    else {
      tVar1 = time((time_t *)0x0);
      seedMT((int)tVar1 + 0x1571);
      local_c = next;
      next = next + 1;
    }
  }
  if (local_c < 0xe3) {
    local_14 = local_c + 0x18d;
  }
  else {
    local_14 = local_c + -0xe3;
  }
  uVar2 = state[local_14] ^ (state[local_c] & 0x80000000 | state[next] & 0x7fffffff) >> 1 ^
          -(state[next] & 1) & 0x9908b0df;
  state[local_c] = uVar2;
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

uint randomMT()
{
    int cur = next;
    if(++next >= N)
    {
        if(next > N) { seedMT(5489U + time(NULL)); cur = next++; }
        else next = 0;
    }
    uint y = (state[cur] & 0x80000000U) | (state[next] & 0x7FFFFFFFU);
    state[cur] = y = state[cur < N-M ? cur + M : cur + M-N] ^ (y >> 1) ^ (-int(y & 1U) & K);
    y ^= (y >> 11);
    y ^= (y <<  7) & 0x9D2C5680U;
    y ^= (y << 15) & 0xEFC60000U;
    y ^= (y >> 18);
    return y;
}